

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void doWarehouseStuff(IClientConnector *clientConnector)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ostream *poVar4;
  Product *p_1;
  _Alloc_hider _Var5;
  WareHouseClient appClient;
  vector<Product,_std::allocator<Product>_> all;
  Product p;
  Product p2;
  JsonRpcClient client;
  WareHouseClient local_160;
  string local_158;
  Product local_138;
  Product local_e8;
  Product local_98;
  JsonRpcClient local_48;
  
  local_160.client = &local_48;
  local_48._vptr_JsonRpcClient = (_func_int **)&PTR__JsonRpcClient_0016e2b0;
  local_48.v = v2;
  paVar1 = &local_138.id.field_2;
  local_138.id._M_string_length = 0;
  local_138.id.field_2._M_local_buf[0] = '\0';
  local_138.price = 0.0;
  paVar2 = &local_138.name.field_2;
  local_138.name._M_string_length = 0;
  local_138.name.field_2._M_local_buf[0] = '\0';
  local_138.cat = order;
  local_138.id._M_dataplus._M_p = (pointer)paVar1;
  local_138.name._M_dataplus._M_p = (pointer)paVar2;
  local_48.connector = clientConnector;
  std::__cxx11::string::_M_replace((ulong)&local_138,0,(char *)0x0,0x14ca80);
  local_138.price = 22.4;
  std::__cxx11::string::_M_replace
            ((ulong)&local_138.name,0,(char *)local_138.name._M_string_length,0x14ca85);
  local_138.cat = cash_carry;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Adding product: ",0x10);
  *(uint *)(freeaddrinfo + *(long *)(std::cout + -0x18)) =
       *(uint *)(freeaddrinfo + *(long *)(std::cout + -0x18)) | 1;
  WareHouseClient::AddProduct(&local_160,&local_138);
  poVar4 = std::ostream::_M_insert<bool>(true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  paVar3 = &local_158.field_2;
  local_158._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"0xff","");
  WareHouseClient::GetProduct(&local_e8,&local_160,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar3) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Found product: ",0xf);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_e8.name._M_dataplus._M_p,
                      local_e8.name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  local_158._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"0xff2","");
  WareHouseClient::GetProduct(&local_98,&local_160,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p != &local_98.name.field_2) {
    operator_delete(local_98.name._M_dataplus._M_p,local_98.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.id._M_dataplus._M_p != &local_98.id.field_2) {
    operator_delete(local_98.id._M_dataplus._M_p,local_98.id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar3) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  WareHouseClient::AllProducts((vector<Product,_std::allocator<Product>_> *)&local_158,&local_160);
  for (_Var5._M_p = local_158._M_dataplus._M_p; _Var5._M_p != (pointer)local_158._M_string_length;
      _Var5._M_p = _Var5._M_p + 0x50) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,*(char **)(_Var5._M_p + 0x28),
                        *(long *)(_Var5._M_p + 0x30));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  std::vector<Product,_std::allocator<Product>_>::~vector
            ((vector<Product,_std::allocator<Product>_> *)&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.name._M_dataplus._M_p != &local_e8.name.field_2) {
    operator_delete(local_e8.name._M_dataplus._M_p,local_e8.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.id._M_dataplus._M_p != &local_e8.id.field_2) {
    operator_delete(local_e8.id._M_dataplus._M_p,local_e8.id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_138.name._M_dataplus._M_p,
                    CONCAT71(local_138.name.field_2._M_allocated_capacity._1_7_,
                             local_138.name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.id._M_dataplus._M_p != paVar1) {
    operator_delete(local_138.id._M_dataplus._M_p,
                    CONCAT71(local_138.id.field_2._M_allocated_capacity._1_7_,
                             local_138.id.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void doWarehouseStuff(IClientConnector &clientConnector) {
  JsonRpcClient client(clientConnector, version::v2);
  WareHouseClient appClient(client);
  Product p;
  p.id = "0xff";
  p.price = 22.4;
  p.name = "Product 1";
  p.cat = category::cash_carry;
  cout << "Adding product: " << std::boolalpha << appClient.AddProduct(p) << "\n";

  Product p2 = appClient.GetProduct("0xff");
  cout << "Found product: " << p2.name << "\n";
  try {
    appClient.GetProduct("0xff2");
  } catch (JsonRpcException &e) {
    cerr << "Error finding product: " << e.what() << "\n";
  }

  auto all = appClient.AllProducts();
  for (const auto &p: all) {
    cout << p.name << endl;
  }
}